

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall
TestMaterial::initializeUniverse
          (TestMaterial *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenameList)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  long lVar5;
  S_Polyhedron *this_00;
  STP_BV *this_01;
  double dVar6;
  S_Object *pSVar7;
  double local_e0;
  double local_d8;
  double local_d0;
  undefined1 local_c8 [8];
  Vector3 position;
  size_t i_1;
  STP_BV *s_1;
  S_Polyhedron *s;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string extension;
  string filename;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenameList_local;
  TestMaterial *this_local;
  
  filename.field_2._12_4_ = 0;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(filenameList);
    if (sVar3 <= (uint)filename.field_2._12_4_) break;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](filenameList,(ulong)(uint)filename.field_2._12_4_);
    std::__cxx11::string::string((string *)(extension.field_2._M_local_buf + 8),(string *)pvVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"",&local_61);
    std::allocator<char>::~allocator(&local_61);
    lVar5 = std::__cxx11::string::find_last_of(extension.field_2._M_local_buf + 8,0x10c1f6);
    if (lVar5 != -1) {
      std::__cxx11::string::find_last_of(extension.field_2._M_local_buf + 8,0x10c1f6);
      std::__cxx11::string::substr((ulong)&s,(ulong)(extension.field_2._M_local_buf + 8));
      std::__cxx11::string::operator=((string *)local_60,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60,"otp");
    if (bVar2) {
      this_00 = (S_Polyhedron *)operator_new(0xf0);
      sch::S_Polyhedron::S_Polyhedron(this_00);
      (**(code **)(*(long *)this_00 + 0x30))(this_00,(undefined1 *)((long)&extension.field_2 + 8));
      sch::CD_Scene::addObject((S_Object *)this);
    }
    else {
      this_01 = (STP_BV *)operator_new(0xe8);
      sch::STP_BV::STP_BV(this_01);
      (**(code **)(*(long *)this_01 + 0x48))(this_01,(undefined1 *)((long)&extension.field_2 + 8));
      sch::CD_Scene::addObject((S_Object *)this);
    }
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(extension.field_2._M_local_buf + 8));
    filename.field_2._12_4_ = filename.field_2._12_4_ + 1;
  }
  position.m_z = 0.0;
  while( true ) {
    dVar1 = position.m_z;
    dVar6 = (double)sch::CD_Scene::size(&this->sObj);
    if ((ulong)dVar6 <= (ulong)dVar1) break;
    local_d0 = (double)((int)((long)position.m_z * 7) +
                       (int)((ulong)((long)position.m_z * 7) / 5) * -5) + -2.0;
    local_d8 = ((double)((int)((long)position.m_z * 5) +
                        (int)((ulong)((long)position.m_z * 5) / 6) * -6) + -3.0) *
               0.8333333333333334;
    local_e0 = ((double)((int)((long)position.m_z * 5) +
                        (int)((ulong)((long)position.m_z * 5) / 7) * -7) - 3.0) * 0.7142857142857143
    ;
    CD_Matrix::Vector3T<double,_false>::Vector3T
              ((Vector3T<double,_false> *)local_c8,&local_d0,&local_d8,&local_e0);
    CD_Matrix::Vector3T<double,_false>::operator*=
              ((Vector3T<double,_false> *)local_c8,(double *)&DispersionScale);
    pSVar7 = sch::CD_Scene::operator[](&this->sObj,(size_t)position.m_z);
    sch::S_Object::setPosition(pSVar7);
    position.m_z = (double)((long)position.m_z + 1);
  }
  DoTest(this);
  return;
}

Assistant:

void TestMaterial::initializeUniverse(const std::vector<std::string> & filenameList)
{
  for(unsigned i=0; i<filenameList.size(); ++i)
  {
    std::string filename = filenameList[i];
    std::string extension = "";
    if(filename.find_last_of(".") != std::string::npos)
    {
      extension = filename.substr(filename.find_last_of(".")+1);
    }
    if(extension == "otp")
    {
      S_Polyhedron* s = new S_Polyhedron();
      s->constructFromFile(filename);
      sObj.addObject(s);
    }
    else //if(extension == "txt")
    {
      STP_BV* s = new STP_BV();
      s->constructFromFileWithGL(filename);
      sObj.addObject(s);
    }
  }

  for (size_t i=0; i<sObj.size(); i++)
  {
    Vector3 position(
      Scalar(7*i%5)-2.,
      (Scalar(5*i%6)-3.)*(5.0/6.),
      (Scalar(5*i%7)-3.)*(5.0/7.)
    );
    position *= DispersionScale;
    sObj[i]->setPosition(position);
  }

  DoTest();
}